

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk.c
# Opt level: O0

void create_reg_file2(archive_entry *ae,char *msg)

{
  int iVar1;
  mode_t mVar2;
  void *buff;
  archive *a;
  la_ssize_t v2;
  char *pcVar3;
  int local_34;
  int i;
  archive *ad;
  char *data;
  int datasize;
  char *msg_local;
  archive_entry *ae_local;
  
  buff = malloc(100000);
  for (local_34 = 0; local_34 < 100000; local_34 = local_34 + 1) {
    *(char *)((long)buff + (long)local_34) = (char)(local_34 % 0x100);
  }
  a = archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'u',(uint)(a != (archive *)0x0),"(ad = archive_write_disk_new()) != NULL",
                   (void *)0x0);
  failure("%s",msg);
  archive_entry_set_size(ae,100000);
  iVar1 = archive_write_header(a,ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'|',0,"0",(long)iVar1,"archive_write_header(ad, ae)",a);
  for (local_34 = 0; local_34 < 0x182b9; local_34 = local_34 + 1000) {
    v2 = archive_write_data_block(a,(void *)((long)buff + (long)local_34),1000,(long)local_34);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk.c"
                        ,L'\x7f',0,"ARCHIVE_OK",v2,"archive_write_data_block(ad, data + i, 1000, i)"
                        ,a);
  }
  iVar1 = archive_write_finish_entry(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'\x81',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",a);
  iVar1 = archive_write_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'\x82',0,"0",(long)iVar1,"archive_write_free(ad)",(void *)0x0);
  pcVar3 = archive_entry_pathname(ae);
  mVar2 = archive_entry_mode(ae);
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'\x85',pcVar3,mVar2 & 0x1ff);
  pcVar3 = archive_entry_pathname(ae);
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'\x86',pcVar3,(long)local_34);
  pcVar3 = archive_entry_pathname(ae);
  assertion_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk.c"
             ,L'\x87',buff,L'𘚠',pcVar3);
  free(buff);
  return;
}

Assistant:

static void create_reg_file2(struct archive_entry *ae, const char *msg)
{
	const int datasize = 100000;
	char *data;
	struct archive *ad;
	int i;

	data = malloc(datasize);
	for (i = 0; i < datasize; i++)
		data[i] = (char)(i % 256);

	/* Write the entry to disk. */
	assert((ad = archive_write_disk_new()) != NULL);
	failure("%s", msg);
	/*
	 * See above for an explanation why this next call
	 * is necessary.
	 */
	archive_entry_set_size(ae, datasize);
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	for (i = 0; i < datasize - 999; i += 1000) {
		assertEqualIntA(ad, ARCHIVE_OK,
		    archive_write_data_block(ad, data + i, 1000, i));
	}
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	assertEqualInt(0, archive_write_free(ad));

	/* Test the entries on disk. */
	assertIsReg(archive_entry_pathname(ae), archive_entry_mode(ae) & 0777);
	assertFileSize(archive_entry_pathname(ae), i);
	assertFileContents(data, datasize, archive_entry_pathname(ae));
	free(data);
}